

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx512::OrientedDiscMiMBIntersectorK<4,_8,_true>::intersect
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  ulong uVar29;
  byte bVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined4 uVar59;
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  RTCFilterFunctionNArguments args;
  RTCFilterFunctionNArguments local_290;
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar5 = context->scene;
  pGVar6 = (pSVar5->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar6->time_range).lower;
  fVar1 = pGVar6->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar1) / ((pGVar6->time_range).upper - fVar1));
  auVar52 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  uVar29 = (ulong)(Disc->primIDs).field_0.i[0];
  auVar52 = vminss_avx(auVar52,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
  auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,auVar52);
  lVar7 = *(long *)&pGVar6[2].numPrimitives;
  lVar37 = (long)(int)auVar40._0_4_ * 0x38;
  lVar8 = *(long *)(lVar7 + 0x10 + lVar37);
  lVar36 = *(long *)(lVar7 + lVar37);
  auVar52 = *(undefined1 (*) [16])(lVar36 + lVar8 * uVar29);
  uVar33 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar53 = *(undefined1 (*) [16])(lVar36 + lVar8 * uVar33);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar54 = *(undefined1 (*) [16])(lVar36 + lVar8 * uVar34);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar56 = *(undefined1 (*) [16])(lVar36 + lVar8 * uVar35);
  p_Var9 = pGVar6[2].intersectionFilterN;
  lVar8 = *(long *)(p_Var9 + lVar37);
  lVar36 = *(long *)(p_Var9 + lVar37 + 0x10);
  auVar58 = *(undefined1 (*) [16])(lVar8 + lVar36 * uVar29);
  auVar46 = *(undefined1 (*) [16])(lVar8 + lVar36 * uVar33);
  auVar61 = *(undefined1 (*) [16])(lVar8 + lVar36 * uVar34);
  auVar55 = *(undefined1 (*) [16])(lVar8 + lVar36 * uVar35);
  lVar36 = (long)((int)auVar40._0_4_ + 1) * 0x38;
  lVar8 = *(long *)(lVar7 + lVar36);
  lVar7 = *(long *)(lVar7 + 0x10 + lVar36);
  auVar47 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar29);
  auVar49 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar33);
  auVar48 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar34);
  auVar50 = *(undefined1 (*) [16])(lVar8 + lVar7 * uVar35);
  lVar7 = *(long *)(p_Var9 + lVar36);
  lVar8 = *(long *)(p_Var9 + lVar36 + 0x10);
  auVar51 = *(undefined1 (*) [16])(lVar7 + uVar29 * lVar8);
  auVar63 = *(undefined1 (*) [16])(lVar7 + uVar33 * lVar8);
  auVar69 = *(undefined1 (*) [16])(lVar7 + uVar34 * lVar8);
  auVar70 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar35);
  auVar39 = vsubss_avx512f(ZEXT416((uint)fVar1),auVar40);
  auVar40 = vunpcklps_avx512vl(auVar52,auVar54);
  auVar52 = vunpckhps_avx(auVar52,auVar54);
  auVar54 = vunpcklps_avx(auVar53,auVar56);
  auVar53 = vunpckhps_avx(auVar53,auVar56);
  auVar41 = vunpcklps_avx512vl(auVar40,auVar54);
  auVar42 = vunpckhps_avx512vl(auVar40,auVar54);
  auVar40 = vunpcklps_avx(auVar52,auVar53);
  auVar45 = vunpcklps_avx(auVar58,auVar61);
  auVar54 = vunpckhps_avx(auVar58,auVar61);
  auVar58 = vunpcklps_avx(auVar46,auVar55);
  auVar56 = vunpckhps_avx(auVar46,auVar55);
  auVar43 = vunpcklps_avx512vl(auVar54,auVar56);
  auVar44 = vunpcklps_avx512vl(auVar45,auVar58);
  auVar45 = vunpckhps_avx512vl(auVar45,auVar58);
  auVar58 = vunpcklps_avx(auVar47,auVar48);
  auVar54 = vunpckhps_avx(auVar47,auVar48);
  auVar46 = vunpcklps_avx(auVar49,auVar50);
  auVar56 = vunpckhps_avx(auVar49,auVar50);
  auVar61 = vunpcklps_avx(auVar58,auVar46);
  auVar58 = vunpckhps_avx(auVar58,auVar46);
  auVar55 = vunpcklps_avx(auVar54,auVar56);
  auVar46 = vunpcklps_avx512vl(auVar51,auVar69);
  auVar47 = vunpckhps_avx512vl(auVar51,auVar69);
  auVar48 = vunpcklps_avx512vl(auVar63,auVar70);
  auVar49 = vunpckhps_avx512vl(auVar63,auVar70);
  auVar47 = vunpcklps_avx(auVar47,auVar49);
  auVar49 = vunpcklps_avx(auVar46,auVar48);
  auVar46 = vunpckhps_avx(auVar46,auVar48);
  auVar48 = vbroadcastss_avx512vl(auVar39);
  auVar50 = vsubss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar39);
  uVar59 = auVar50._0_4_;
  auVar69._4_4_ = uVar59;
  auVar69._0_4_ = uVar59;
  auVar69._8_4_ = uVar59;
  auVar69._12_4_ = uVar59;
  fVar65 = auVar48._0_4_;
  auVar51._0_4_ = fVar65 * auVar61._0_4_;
  fVar66 = auVar48._4_4_;
  auVar51._4_4_ = fVar66 * auVar61._4_4_;
  fVar67 = auVar48._8_4_;
  auVar51._8_4_ = fVar67 * auVar61._8_4_;
  fVar68 = auVar48._12_4_;
  auVar51._12_4_ = fVar68 * auVar61._12_4_;
  auVar61._0_4_ = fVar65 * auVar58._0_4_;
  auVar61._4_4_ = fVar66 * auVar58._4_4_;
  auVar61._8_4_ = fVar67 * auVar58._8_4_;
  auVar61._12_4_ = fVar68 * auVar58._12_4_;
  auVar63._0_4_ = fVar65 * auVar55._0_4_;
  auVar63._4_4_ = fVar66 * auVar55._4_4_;
  auVar63._8_4_ = fVar67 * auVar55._8_4_;
  auVar63._12_4_ = fVar68 * auVar55._12_4_;
  auVar58 = vfmadd231ps_fma(auVar51,auVar69,auVar41);
  auVar61 = vfmadd231ps_fma(auVar61,auVar69,auVar42);
  auVar55 = vfmadd231ps_fma(auVar63,auVar69,auVar40);
  auVar48._0_4_ = fVar65 * auVar49._0_4_;
  auVar48._4_4_ = fVar66 * auVar49._4_4_;
  auVar48._8_4_ = fVar67 * auVar49._8_4_;
  auVar48._12_4_ = fVar68 * auVar49._12_4_;
  auVar49._0_4_ = fVar65 * auVar46._0_4_;
  auVar49._4_4_ = fVar66 * auVar46._4_4_;
  auVar49._8_4_ = fVar67 * auVar46._8_4_;
  auVar49._12_4_ = fVar68 * auVar46._12_4_;
  auVar50._0_4_ = fVar65 * auVar47._0_4_;
  auVar50._4_4_ = fVar66 * auVar47._4_4_;
  auVar50._8_4_ = fVar67 * auVar47._8_4_;
  auVar50._12_4_ = fVar68 * auVar47._12_4_;
  local_210 = vfmadd231ps_avx512vl(auVar48,auVar69,auVar44);
  local_200 = vfmadd231ps_avx512vl(auVar49,auVar69,auVar45);
  auVar46 = vpbroadcastd_avx512vl();
  uVar20 = vpcmpgtd_avx512vl(auVar46,_DAT_01f4ad30);
  local_1b0 = vpbroadcastd_avx512vl();
  fVar1 = *(float *)(ray + k * 4);
  auVar70._4_4_ = fVar1;
  auVar70._0_4_ = fVar1;
  auVar70._8_4_ = fVar1;
  auVar70._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x20);
  auVar40._4_4_ = fVar2;
  auVar40._0_4_ = fVar2;
  auVar40._8_4_ = fVar2;
  auVar40._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x40);
  auVar45._4_4_ = fVar3;
  auVar45._0_4_ = fVar3;
  auVar45._8_4_ = fVar3;
  auVar45._12_4_ = fVar3;
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar39._4_4_ = uVar59;
  auVar39._0_4_ = uVar59;
  auVar39._8_4_ = uVar59;
  auVar39._12_4_ = uVar59;
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  local_1f0 = vfmadd231ps_avx512vl(auVar50,auVar69,auVar43);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar46 = vmulps_avx512vl(local_1f0,auVar49);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar47,local_200);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar39,local_210);
  auVar48 = vxorps_avx512vl(auVar43,auVar43);
  uVar29 = vcmpps_avx512vl(auVar46,auVar48,0);
  auVar48 = vsubps_avx512vl(auVar58,auVar70);
  auVar50 = vsubps_avx512vl(auVar61,auVar40);
  auVar51 = vsubps_avx512vl(auVar55,auVar45);
  auVar51 = vmulps_avx512vl(local_1f0,auVar51);
  auVar50 = vfmadd231ps_avx512vl(auVar51,local_200,auVar50);
  auVar48 = vfmadd231ps_avx512vl(auVar50,local_210,auVar48);
  auVar46 = vdivps_avx512vl(auVar48,auVar46);
  bVar10 = (bool)((byte)uVar29 & 1);
  local_220._0_4_ = (uint)bVar10 * auVar48._0_4_ | (uint)!bVar10 * auVar46._0_4_;
  bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
  local_220._4_4_ = (uint)bVar10 * auVar48._4_4_ | (uint)!bVar10 * auVar46._4_4_;
  bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
  local_220._8_4_ = (uint)bVar10 * auVar48._8_4_ | (uint)!bVar10 * auVar46._8_4_;
  bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
  local_220._12_4_ = (uint)bVar10 * auVar48._12_4_ | (uint)!bVar10 * auVar46._12_4_;
  auVar71 = ZEXT1664(local_220);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  auVar72 = ZEXT1664(auVar46);
  uVar18 = vcmpps_avx512vl(local_220,auVar46,2);
  uVar59 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar46._4_4_ = uVar59;
  auVar46._0_4_ = uVar59;
  auVar46._8_4_ = uVar59;
  auVar46._12_4_ = uVar59;
  uVar19 = vcmpps_avx512vl(local_220,auVar46,0xd);
  bVar28 = (byte)uVar18 & (byte)uVar19 & ~(byte)uVar29 & (byte)uVar20 & 0xf;
  if (bVar28 != 0) {
    auVar52 = vunpckhps_avx(auVar52,auVar53);
    auVar53 = vunpckhps_avx(auVar54,auVar56);
    auVar54._0_4_ = fVar65 * auVar53._0_4_;
    auVar54._4_4_ = fVar66 * auVar53._4_4_;
    auVar54._8_4_ = fVar67 * auVar53._8_4_;
    auVar54._12_4_ = fVar68 * auVar53._12_4_;
    auVar56 = vfmadd231ps_fma(auVar54,auVar69,auVar52);
    auVar52 = vmulps_avx512vl(auVar39,local_220);
    auVar53 = vmulps_avx512vl(auVar47,local_220);
    auVar54 = vmulps_avx512vl(auVar49,local_220);
    auVar47._0_4_ = fVar1 + auVar52._0_4_;
    auVar47._4_4_ = fVar1 + auVar52._4_4_;
    auVar47._8_4_ = fVar1 + auVar52._8_4_;
    auVar47._12_4_ = fVar1 + auVar52._12_4_;
    auVar41._0_4_ = fVar2 + auVar53._0_4_;
    auVar41._4_4_ = fVar2 + auVar53._4_4_;
    auVar41._8_4_ = fVar2 + auVar53._8_4_;
    auVar41._12_4_ = fVar2 + auVar53._12_4_;
    auVar42._0_4_ = fVar3 + auVar54._0_4_;
    auVar42._4_4_ = fVar3 + auVar54._4_4_;
    auVar42._8_4_ = fVar3 + auVar54._8_4_;
    auVar42._12_4_ = fVar3 + auVar54._12_4_;
    auVar52 = vsubps_avx(auVar47,auVar58);
    auVar53 = vsubps_avx(auVar41,auVar61);
    auVar54 = vsubps_avx(auVar42,auVar55);
    auVar58._0_4_ = auVar54._0_4_ * auVar54._0_4_;
    auVar58._4_4_ = auVar54._4_4_ * auVar54._4_4_;
    auVar58._8_4_ = auVar54._8_4_ * auVar54._8_4_;
    auVar58._12_4_ = auVar54._12_4_ * auVar54._12_4_;
    auVar53 = vfmadd231ps_fma(auVar58,auVar53,auVar53);
    auVar52 = vfmadd231ps_fma(auVar53,auVar52,auVar52);
    auVar53._0_4_ = auVar56._0_4_ * auVar56._0_4_;
    auVar53._4_4_ = auVar56._4_4_ * auVar56._4_4_;
    auVar53._8_4_ = auVar56._8_4_ * auVar56._8_4_;
    auVar53._12_4_ = auVar56._12_4_ * auVar56._12_4_;
    uVar18 = vcmpps_avx512vl(auVar52,auVar53,1);
    bVar28 = bVar28 & (byte)uVar18;
    if (bVar28 != 0) {
      local_240 = ZEXT432(0) << 0x20;
      auVar52._8_4_ = 0x7f800000;
      auVar52._0_8_ = 0x7f8000007f800000;
      auVar52._12_4_ = 0x7f800000;
      auVar60 = ZEXT1664(auVar52);
      auVar52 = vblendmps_avx512vl(auVar52,local_220);
      auVar56._4_4_ = (uint)(bVar28 >> 1 & 1) * auVar52._4_4_;
      auVar56._0_4_ = (uint)(bVar28 & 1) * auVar52._0_4_;
      auVar56._8_4_ = (uint)(bVar28 >> 2 & 1) * auVar52._8_4_;
      auVar56._12_4_ = (uint)(bVar28 >> 3) * auVar52._12_4_;
      auVar52 = vshufps_avx(auVar56,auVar56,0xb1);
      auVar52 = vminps_avx(auVar52,auVar56);
      auVar53 = vshufpd_avx(auVar52,auVar52,1);
      auVar52 = vminps_avx(auVar53,auVar52);
      uVar18 = vcmpps_avx512vl(auVar56,auVar52,0);
      bVar30 = (byte)uVar18 & bVar28;
      bVar11 = bVar28;
      if (bVar30 != 0) {
        bVar11 = bVar30;
      }
      uVar31 = 0;
      for (uVar32 = (uint)bVar11; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x80000000) {
        uVar31 = uVar31 + 1;
      }
      auVar57 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
      auVar62 = ZEXT3264(auVar57);
      auVar57 = vpcmpeqd_avx2(ZEXT1632(auVar55),ZEXT1632(auVar55));
      auVar64 = ZEXT3264(auVar57);
      do {
        local_290.hit = local_180;
        local_250 = auVar71._0_16_;
        local_260 = auVar72._0_16_;
        uVar38 = uVar31 & 0xff;
        uVar32 = *(uint *)(local_1b0 + (ulong)uVar38 * 4);
        pGVar6 = (pSVar5->geometries).items[uVar32].ptr;
        if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          bVar28 = ~(byte)(1 << (uVar31 & 0x1f)) & bVar28;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar29 = (ulong)(uVar38 << 2);
            uVar59 = *(undefined4 *)(local_240 + uVar29);
            uVar4 = *(undefined4 *)(local_240 + uVar29 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_220 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_210 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_200 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1f0 + uVar29);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar59;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x220) =
                 *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar29);
            *(uint *)(ray + k * 4 + 0x240) = uVar32;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            return;
          }
          uVar29 = (ulong)(uVar38 * 4);
          local_120 = *(undefined4 *)(local_240 + uVar29);
          local_100 = *(undefined4 *)(local_240 + uVar29 + 0x10);
          local_c0 = vpbroadcastd_avx512vl();
          uVar59 = *(undefined4 *)((long)&(Disc->primIDs).field_0 + uVar29);
          local_e0._4_4_ = uVar59;
          local_e0._0_4_ = uVar59;
          local_e0._8_4_ = uVar59;
          local_e0._12_4_ = uVar59;
          local_e0._16_4_ = uVar59;
          local_e0._20_4_ = uVar59;
          local_e0._24_4_ = uVar59;
          local_e0._28_4_ = uVar59;
          uVar59 = *(undefined4 *)(local_210 + uVar29);
          uVar4 = *(undefined4 *)(local_200 + uVar29);
          local_160._4_4_ = uVar4;
          local_160._0_4_ = uVar4;
          local_160._8_4_ = uVar4;
          local_160._12_4_ = uVar4;
          local_160._16_4_ = uVar4;
          local_160._20_4_ = uVar4;
          local_160._24_4_ = uVar4;
          local_160._28_4_ = uVar4;
          uVar4 = *(undefined4 *)(local_1f0 + uVar29);
          local_140._4_4_ = uVar4;
          local_140._0_4_ = uVar4;
          local_140._8_4_ = uVar4;
          local_140._12_4_ = uVar4;
          local_140._16_4_ = uVar4;
          local_140._20_4_ = uVar4;
          local_140._24_4_ = uVar4;
          local_140._28_4_ = uVar4;
          local_180[0] = (RTCHitN)(char)uVar59;
          local_180[1] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar59;
          local_180[5] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar59;
          local_180[9] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar59;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar59;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar59;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar59;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar59;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar59 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar59 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar59 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_220 + uVar29);
          local_1e0 = auVar62._0_32_;
          local_290.valid = (int *)local_1e0;
          local_290.geometryUserPtr = pGVar6->userPtr;
          local_290.context = context->user;
          local_290.N = 8;
          local_1a0 = auVar62._0_32_;
          local_290.ray = (RTCRayN *)ray;
          if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            auVar57 = ZEXT1632(auVar64._0_16_);
            (*pGVar6->intersectionFilterN)(&local_290);
            auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
            auVar64 = ZEXT3264(auVar57);
            auVar62 = ZEXT3264(local_1a0);
            auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar72 = ZEXT1664(local_260);
            auVar71 = ZEXT1664(local_250);
          }
          if (local_1e0 == (undefined1  [32])0x0) {
LAB_018737ae:
            *(int *)(ray + k * 4 + 0x100) = auVar72._0_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              auVar57 = ZEXT1632(auVar64._0_16_);
              (*p_Var9)(&local_290);
              auVar57 = vpcmpeqd_avx2(auVar57,auVar57);
              auVar64 = ZEXT3264(auVar57);
              auVar62 = ZEXT3264(local_1a0);
              auVar60 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar72 = ZEXT1664(local_260);
              auVar71 = ZEXT1664(local_250);
            }
            if (local_1e0 == (undefined1  [32])0x0) goto LAB_018737ae;
            uVar29 = vptestmd_avx512vl(local_1e0,local_1e0);
            iVar21 = *(int *)(local_290.hit + 4);
            iVar22 = *(int *)(local_290.hit + 8);
            iVar23 = *(int *)(local_290.hit + 0xc);
            iVar24 = *(int *)(local_290.hit + 0x10);
            iVar25 = *(int *)(local_290.hit + 0x14);
            iVar26 = *(int *)(local_290.hit + 0x18);
            iVar27 = *(int *)(local_290.hit + 0x1c);
            bVar11 = (byte)uVar29;
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar17 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x180) =
                 (uint)(bVar11 & 1) * *(int *)local_290.hit |
                 (uint)!(bool)(bVar11 & 1) * *(int *)(local_290.ray + 0x180);
            *(uint *)(local_290.ray + 0x184) =
                 (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_290.ray + 0x184);
            *(uint *)(local_290.ray + 0x188) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x188);
            *(uint *)(local_290.ray + 0x18c) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x18c);
            *(uint *)(local_290.ray + 400) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 400);
            *(uint *)(local_290.ray + 0x194) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x194);
            *(uint *)(local_290.ray + 0x198) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x198);
            *(uint *)(local_290.ray + 0x19c) =
                 (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x19c);
            iVar21 = *(int *)(local_290.hit + 0x24);
            iVar22 = *(int *)(local_290.hit + 0x28);
            iVar23 = *(int *)(local_290.hit + 0x2c);
            iVar24 = *(int *)(local_290.hit + 0x30);
            iVar25 = *(int *)(local_290.hit + 0x34);
            iVar26 = *(int *)(local_290.hit + 0x38);
            iVar27 = *(int *)(local_290.hit + 0x3c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar17 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1a0) =
                 (uint)(bVar11 & 1) * *(int *)(local_290.hit + 0x20) |
                 (uint)!(bool)(bVar11 & 1) * *(int *)(local_290.ray + 0x1a0);
            *(uint *)(local_290.ray + 0x1a4) =
                 (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1a4);
            *(uint *)(local_290.ray + 0x1a8) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1a8);
            *(uint *)(local_290.ray + 0x1ac) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1ac);
            *(uint *)(local_290.ray + 0x1b0) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1b0);
            *(uint *)(local_290.ray + 0x1b4) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1b4);
            *(uint *)(local_290.ray + 0x1b8) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1b8);
            *(uint *)(local_290.ray + 0x1bc) =
                 (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1bc);
            iVar21 = *(int *)(local_290.hit + 0x44);
            iVar22 = *(int *)(local_290.hit + 0x48);
            iVar23 = *(int *)(local_290.hit + 0x4c);
            iVar24 = *(int *)(local_290.hit + 0x50);
            iVar25 = *(int *)(local_290.hit + 0x54);
            iVar26 = *(int *)(local_290.hit + 0x58);
            iVar27 = *(int *)(local_290.hit + 0x5c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar17 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1c0) =
                 (uint)(bVar11 & 1) * *(int *)(local_290.hit + 0x40) |
                 (uint)!(bool)(bVar11 & 1) * *(int *)(local_290.ray + 0x1c0);
            *(uint *)(local_290.ray + 0x1c4) =
                 (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1c4);
            *(uint *)(local_290.ray + 0x1c8) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1c8);
            *(uint *)(local_290.ray + 0x1cc) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1cc);
            *(uint *)(local_290.ray + 0x1d0) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1d0);
            *(uint *)(local_290.ray + 0x1d4) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 0x1d4);
            *(uint *)(local_290.ray + 0x1d8) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1d8);
            *(uint *)(local_290.ray + 0x1dc) =
                 (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1dc);
            iVar21 = *(int *)(local_290.hit + 100);
            iVar22 = *(int *)(local_290.hit + 0x68);
            iVar23 = *(int *)(local_290.hit + 0x6c);
            iVar24 = *(int *)(local_290.hit + 0x70);
            iVar25 = *(int *)(local_290.hit + 0x74);
            iVar26 = *(int *)(local_290.hit + 0x78);
            iVar27 = *(int *)(local_290.hit + 0x7c);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            bVar12 = (bool)((byte)(uVar29 >> 2) & 1);
            bVar13 = (bool)((byte)(uVar29 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar29 >> 4) & 1);
            bVar15 = (bool)((byte)(uVar29 >> 5) & 1);
            bVar16 = (bool)((byte)(uVar29 >> 6) & 1);
            bVar17 = SUB81(uVar29 >> 7,0);
            *(uint *)(local_290.ray + 0x1e0) =
                 (uint)(bVar11 & 1) * *(int *)(local_290.hit + 0x60) |
                 (uint)!(bool)(bVar11 & 1) * *(int *)(local_290.ray + 0x1e0);
            *(uint *)(local_290.ray + 0x1e4) =
                 (uint)bVar10 * iVar21 | (uint)!bVar10 * *(int *)(local_290.ray + 0x1e4);
            *(uint *)(local_290.ray + 0x1e8) =
                 (uint)bVar12 * iVar22 | (uint)!bVar12 * *(int *)(local_290.ray + 0x1e8);
            *(uint *)(local_290.ray + 0x1ec) =
                 (uint)bVar13 * iVar23 | (uint)!bVar13 * *(int *)(local_290.ray + 0x1ec);
            *(uint *)(local_290.ray + 0x1f0) =
                 (uint)bVar14 * iVar24 | (uint)!bVar14 * *(int *)(local_290.ray + 0x1f0);
            *(uint *)(local_290.ray + 500) =
                 (uint)bVar15 * iVar25 | (uint)!bVar15 * *(int *)(local_290.ray + 500);
            *(uint *)(local_290.ray + 0x1f8) =
                 (uint)bVar16 * iVar26 | (uint)!bVar16 * *(int *)(local_290.ray + 0x1f8);
            *(uint *)(local_290.ray + 0x1fc) =
                 (uint)bVar17 * iVar27 | (uint)!bVar17 * *(int *)(local_290.ray + 0x1fc);
            auVar57._0_4_ =
                 (uint)(bVar11 & 1) * *(int *)(local_290.hit + 0x80) |
                 (uint)!(bool)(bVar11 & 1) * *(int *)(local_290.ray + 0x200);
            bVar10 = (bool)((byte)(uVar29 >> 1) & 1);
            auVar57._4_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x84) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x204);
            bVar10 = (bool)((byte)(uVar29 >> 2) & 1);
            auVar57._8_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x88) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x208);
            bVar10 = (bool)((byte)(uVar29 >> 3) & 1);
            auVar57._12_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x8c) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x20c);
            bVar10 = (bool)((byte)(uVar29 >> 4) & 1);
            auVar57._16_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x90) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x210);
            bVar10 = (bool)((byte)(uVar29 >> 5) & 1);
            auVar57._20_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x94) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x214);
            bVar10 = (bool)((byte)(uVar29 >> 6) & 1);
            auVar57._24_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x98) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x218);
            bVar10 = SUB81(uVar29 >> 7,0);
            auVar57._28_4_ =
                 (uint)bVar10 * *(int *)(local_290.hit + 0x9c) |
                 (uint)!bVar10 * *(int *)(local_290.ray + 0x21c);
            *(undefined1 (*) [32])(local_290.ray + 0x200) = auVar57;
            auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xa0));
            *(undefined1 (*) [32])(local_290.ray + 0x220) = auVar57;
            auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xc0));
            *(undefined1 (*) [32])(local_290.ray + 0x240) = auVar57;
            auVar57 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0xe0));
            *(undefined1 (*) [32])(local_290.ray + 0x260) = auVar57;
            auVar57 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_290.hit + 0x100));
            *(undefined1 (*) [32])(local_290.ray + 0x280) = auVar57;
            auVar72 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
          }
          auVar56 = vbroadcastss_avx512vl(auVar72._0_16_);
          uVar18 = vcmpps_avx512vl(auVar71._0_16_,auVar56,2);
          bVar28 = ~(byte)(1 << (uVar31 & 0x1f)) & bVar28 & (byte)uVar18;
        }
        if (bVar28 == 0) {
          return;
        }
        auVar52 = vblendmps_avx512vl(auVar60._0_16_,auVar71._0_16_);
        auVar55._0_4_ =
             (uint)(bVar28 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar56._0_4_;
        bVar10 = (bool)(bVar28 >> 1 & 1);
        auVar55._4_4_ = (uint)bVar10 * auVar52._4_4_ | (uint)!bVar10 * auVar56._4_4_;
        bVar10 = (bool)(bVar28 >> 2 & 1);
        auVar55._8_4_ = (uint)bVar10 * auVar52._8_4_ | (uint)!bVar10 * auVar56._8_4_;
        auVar55._12_4_ =
             (uint)(bVar28 >> 3) * auVar52._12_4_ | (uint)!(bool)(bVar28 >> 3) * auVar56._12_4_;
        auVar52 = vshufps_avx(auVar55,auVar55,0xb1);
        auVar52 = vminps_avx(auVar52,auVar55);
        auVar53 = vshufpd_avx(auVar52,auVar52,1);
        auVar52 = vminps_avx(auVar53,auVar52);
        uVar18 = vcmpps_avx512vl(auVar55,auVar52,0);
        bVar30 = (byte)uVar18 & bVar28;
        bVar11 = bVar28;
        if (bVar30 != 0) {
          bVar11 = bVar30;
        }
        uVar31 = 0;
        for (uVar32 = (uint)bVar11; auVar56 = auVar55, (uVar32 & 1) == 0;
            uVar32 = uVar32 >> 1 | 0x80000000) {
          uVar31 = uVar31 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }